

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O2

aura_transport * aura_transport_lookup(char *name)

{
  int iVar1;
  list_head *plVar2;
  
  plVar2 = &transports;
  do {
    plVar2 = plVar2->next;
    if (plVar2 == &transports) {
      return (aura_transport *)0x0;
    }
    iVar1 = strcmp((char *)plVar2[-5].next,name);
  } while (iVar1 != 0);
  *(int *)&plVar2[-1].prev = *(int *)&plVar2[-1].prev + 1;
  return (aura_transport *)(plVar2 + -5);
}

Assistant:

const struct aura_transport *aura_transport_lookup(const char *name)
{
	struct aura_transport *pos;

	list_for_each_entry(pos, &transports, registry)
	if (strcmp(pos->name, name) == 0) {
		pos->usage++;
		return pos;
	}
	return NULL;
}